

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O2

char __thiscall QJsonPrivate::Parser::nextToken(Parser *this)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  
  bVar3 = eatSpace(this);
  if (bVar3) {
    pbVar2 = (byte *)this->json;
    this->json = (char *)(pbVar2 + 1);
    bVar1 = *pbVar2;
    if ((bVar1 - 0x22 < 0x3c) && ((0xa00000001000401U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) != 0))
    {
      return bVar1;
    }
    if (bVar1 == 0x7b) {
      return '{';
    }
    if (bVar1 == 0x7d) {
      return '}';
    }
  }
  return '\0';
}

Assistant:

char Parser::nextToken()
{
    if (!eatSpace())
        return 0;
    char token = *json++;
    switch (token) {
    case BeginArray:
    case BeginObject:
    case NameSeparator:
    case ValueSeparator:
    case EndArray:
    case EndObject:
    case Quote:
        break;
    default:
        token = 0;
        break;
    }
    return token;
}